

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)

{
  ImGuiWindow *window;
  uint in_EDI;
  undefined1 popup_hierarchy_00;
  bool popup_hierarchy;
  ImGuiWindow *cur_window;
  ImGuiWindow *ref_window;
  ImGuiContext *g;
  ImGuiWindow *window_00;
  bool local_1;
  
  window_00 = GImGui->NavWindow;
  window = GImGui->CurrentWindow;
  if (window_00 == (ImGuiWindow *)0x0) {
    local_1 = false;
  }
  else if ((in_EDI & 4) == 0) {
    popup_hierarchy_00 = (in_EDI & 8) == 0;
    if ((in_EDI & 2) != 0) {
      window = GetCombinedRootWindow(window,(bool)popup_hierarchy_00);
    }
    if ((in_EDI & 1) == 0) {
      local_1 = window_00 == window;
    }
    else {
      local_1 = IsWindowChildOf(window_00,window,(bool)popup_hierarchy_00);
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ImGui::IsWindowFocused(ImGuiFocusedFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* ref_window = g.NavWindow;
    ImGuiWindow* cur_window = g.CurrentWindow;

    if (ref_window == NULL)
        return false;
    if (flags & ImGuiFocusedFlags_AnyWindow)
        return true;

    IM_ASSERT(cur_window); // Not inside a Begin()/End()
    const bool popup_hierarchy = (flags & ImGuiFocusedFlags_NoPopupHierarchy) == 0;
    if (flags & ImGuiHoveredFlags_RootWindow)
        cur_window = GetCombinedRootWindow(cur_window, popup_hierarchy);

    if (flags & ImGuiHoveredFlags_ChildWindows)
        return IsWindowChildOf(ref_window, cur_window, popup_hierarchy);
    else
        return (ref_window == cur_window);
}